

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeStateApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::get_active_uniform(NegativeTestContext *ctx)

{
  undefined *puVar1;
  deUint32 dVar2;
  RenderContext *renderCtx;
  TestLog *this;
  MessageBuilder *pMVar3;
  allocator<char> local_471;
  string local_470;
  allocator<char> local_449;
  string local_448;
  allocator<char> local_421;
  string local_420;
  allocator<char> local_3f9;
  string local_3f8;
  MessageBuilder local_3d8;
  GLuint local_258;
  allocator<char> local_251;
  GLint numActiveUniforms;
  string local_230;
  allocator<char> local_1f9;
  string local_1f8;
  string local_1d8;
  ProgramSources local_1b8;
  undefined1 local_e8 [8];
  ShaderProgram program;
  GLuint shader;
  NegativeTestContext *ctx_local;
  
  program.m_program.m_info.linkTimeUs._4_4_ =
       glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x8b31);
  renderCtx = NegativeTestContext::getRenderContext(ctx);
  puVar1 = uniformTestVertSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,puVar1,&local_1f9);
  getVtxFragVersionSources(&local_1d8,&local_1f8,ctx);
  puVar1 = uniformTestFragSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&numActiveUniforms,puVar1,&local_251)
  ;
  getVtxFragVersionSources(&local_230,(string *)&numActiveUniforms,ctx);
  glu::makeVtxFragSources(&local_1b8,&local_1d8,&local_230);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_e8,renderCtx,&local_1b8);
  glu::ProgramSources::~ProgramSources(&local_1b8);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&numActiveUniforms);
  std::allocator<char>::~allocator(&local_251);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  local_258 = 0xffffffff;
  dVar2 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e8);
  glu::CallLogWrapper::glGetProgramiv(&ctx->super_CallLogWrapper,dVar2,0x8b86,(GLint *)&local_258);
  this = glu::CallLogWrapper::getLog(&ctx->super_CallLogWrapper);
  tcu::TestLog::operator<<(&local_3d8,this,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar3 = tcu::MessageBuilder::operator<<(&local_3d8,(char (*) [25])"// GL_ACTIVE_UNIFORMS = ");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(int *)&local_258);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [15])" (expected 4).");
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_3d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f8,
             "GL_INVALID_VALUE is generated if program is not a value generated by OpenGL.",
             &local_3f9);
  NegativeTestContext::beginSection(ctx,&local_3f8);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::allocator<char>::~allocator(&local_3f9);
  glu::CallLogWrapper::glGetActiveUniform
            (&ctx->super_CallLogWrapper,0xffffffff,0,0,(GLsizei *)0x0,(GLint *)0x0,(GLenum *)0x0,
             (GLchar *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_420,
             "GL_INVALID_OPERATION is generated if program is not a program object.",&local_421);
  NegativeTestContext::beginSection(ctx,&local_420);
  std::__cxx11::string::~string((string *)&local_420);
  std::allocator<char>::~allocator(&local_421);
  glu::CallLogWrapper::glGetActiveUniform
            (&ctx->super_CallLogWrapper,program.m_program.m_info.linkTimeUs._4_4_,0,0,(GLsizei *)0x0
             ,(GLint *)0x0,(GLenum *)0x0,(GLchar *)0x0);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_448,
             "GL_INVALID_VALUE is generated if index is greater than or equal to the number of active uniform variables in program."
             ,&local_449);
  NegativeTestContext::beginSection(ctx,&local_448);
  std::__cxx11::string::~string((string *)&local_448);
  std::allocator<char>::~allocator(&local_449);
  dVar2 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e8);
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,dVar2);
  dVar2 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e8);
  glu::CallLogWrapper::glGetActiveUniform
            (&ctx->super_CallLogWrapper,dVar2,local_258,0,(GLsizei *)0x0,(GLint *)0x0,(GLenum *)0x0,
             (GLchar *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_470,"GL_INVALID_VALUE is generated if bufSize is less than 0.",
             &local_471);
  NegativeTestContext::beginSection(ctx,&local_470);
  std::__cxx11::string::~string((string *)&local_470);
  std::allocator<char>::~allocator(&local_471);
  dVar2 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e8);
  glu::CallLogWrapper::glGetActiveUniform
            (&ctx->super_CallLogWrapper,dVar2,0,-1,(GLsizei *)0x0,(GLint *)0x0,(GLenum *)0x0,
             (GLchar *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,0);
  glu::CallLogWrapper::glDeleteShader
            (&ctx->super_CallLogWrapper,program.m_program.m_info.linkTimeUs._4_4_);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_e8);
  return;
}

Assistant:

void get_active_uniform (NegativeTestContext& ctx)
{
	GLuint				shader				= ctx.glCreateShader(GL_VERTEX_SHADER);
	glu::ShaderProgram	program				(ctx.getRenderContext(), glu::makeVtxFragSources(getVtxFragVersionSources(uniformTestVertSource, ctx), getVtxFragVersionSources(uniformTestFragSource, ctx)));
	GLint				numActiveUniforms	= -1;

	ctx.glGetProgramiv	(program.getProgram(), GL_ACTIVE_UNIFORMS,	&numActiveUniforms);
	ctx.getLog() << TestLog::Message << "// GL_ACTIVE_UNIFORMS = " << numActiveUniforms << " (expected 4)." << TestLog::EndMessage;

	ctx.beginSection("GL_INVALID_VALUE is generated if program is not a value generated by OpenGL.");
	ctx.glGetActiveUniform(-1, 0, 0, 0, 0, 0, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if program is not a program object.");
	ctx.glGetActiveUniform(shader, 0, 0, 0, 0, 0, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if index is greater than or equal to the number of active uniform variables in program.");
	ctx.glUseProgram(program.getProgram());
	ctx.glGetActiveUniform(program.getProgram(), numActiveUniforms, 0, 0, 0, 0, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if bufSize is less than 0.");
	ctx.glGetActiveUniform(program.getProgram(), 0, -1, 0, 0, 0, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.glUseProgram(0);
	ctx.glDeleteShader(shader);
}